

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O3

bool __thiscall higan::HttpRequest::AddHeader(HttpRequest *this,char *begin,char *end)

{
  char *pcVar1;
  mapped_type *this_00;
  key_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (begin,end,": ","");
  if (2 < (long)end - (long)pcVar1) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar1 + 2,end);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,begin,pcVar1);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->headers_,&local_70);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return 2 < (long)end - (long)pcVar1;
}

Assistant:

bool HttpRequest::AddHeader(const char* begin, const char* end)
{

	const char* k_end = std::search(begin, end, COLON, COLON + 2);

	if (end - k_end < 3)
	{
		return false;
	}

	headers_[{ begin, k_end}] = { k_end + 2, end};
	return true;
}